

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_scanLt(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  uint local_6c;
  uint local_5c;
  uint local_4c;
  uint local_44;
  uint local_38;
  int hadColon;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (ptr == end) {
    return -1;
  }
  if (*ptr == '\0') {
    local_38 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
  }
  else {
    local_38 = unicode_byte_type(*ptr,ptr[1]);
  }
  switch(local_38) {
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    *nextTokPtr = ptr;
    return 0;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    *nextTokPtr = ptr;
    return 0;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    *nextTokPtr = ptr;
    return 0;
  default:
    *nextTokPtr = ptr;
    return 0;
  case 0xf:
    iVar2 = big2_scanPi(enc,ptr + 2,end,nextTokPtr);
    return iVar2;
  case 0x10:
    pcVar3 = ptr + 2;
    if (pcVar3 == end) {
      return -1;
    }
    if (*pcVar3 == '\0') {
      local_44 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
    }
    else {
      local_44 = unicode_byte_type(*pcVar3,ptr[3]);
    }
    if (local_44 != 0x14) {
      if (local_44 == 0x1b) {
        iVar2 = big2_scanComment(enc,ptr + 4,end,nextTokPtr);
        return iVar2;
      }
      *nextTokPtr = pcVar3;
      return 0;
    }
    iVar2 = big2_scanCdataSection(enc,ptr + 4,end,nextTokPtr);
    return iVar2;
  case 0x11:
    iVar2 = big2_scanEndTag(enc,ptr + 2,end,nextTokPtr);
    return iVar2;
  case 0x1d:
    if ((namingBitmap
         [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)*ptr] * 8 + ((int)(uint)(byte)ptr[1] >> 5))]
        & 1 << (ptr[1] & 0x1fU)) == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
  case 0x16:
  case 0x18:
    end_local = ptr + 2;
    bVar1 = false;
  }
  do {
    if (end_local == end) {
      return -1;
    }
    if (*end_local == '\0') {
      local_4c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[1]);
    }
    else {
      local_4c = unicode_byte_type(*end_local,end_local[1]);
    }
    switch(local_4c) {
    case 5:
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      *nextTokPtr = end_local;
      return 0;
    case 6:
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      *nextTokPtr = end_local;
      return 0;
    case 7:
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      *nextTokPtr = end_local;
      return 0;
    default:
      *nextTokPtr = end_local;
      return 0;
    case 9:
    case 10:
    case 0x15:
      pcVar3 = end_local;
      goto LAB_0091a361;
    case 0xb:
      goto LAB_0091a53f;
    case 0x11:
      goto LAB_0091a55c;
    case 0x17:
      if (bVar1) {
        *nextTokPtr = end_local;
        return 0;
      }
      bVar1 = true;
      pbVar4 = (byte *)(end_local + 2);
      if (pbVar4 == (byte *)end) {
        return -1;
      }
      if (*pbVar4 == 0) {
        local_5c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[3]);
      }
      else {
        local_5c = unicode_byte_type(*pbVar4,end_local[3]);
      }
      switch(local_5c) {
      case 5:
        if ((long)end - (long)pbVar4 < 2) {
          return -2;
        }
        *nextTokPtr = (char *)pbVar4;
        return 0;
      case 6:
        if ((long)end - (long)pbVar4 < 3) {
          return -2;
        }
        *nextTokPtr = (char *)pbVar4;
        return 0;
      case 7:
        if ((long)end - (long)pbVar4 < 4) {
          return -2;
        }
        *nextTokPtr = (char *)pbVar4;
        return 0;
      default:
        *nextTokPtr = (char *)pbVar4;
        return 0;
      case 0x1d:
        if ((namingBitmap
             [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[*pbVar4] * 8 +
                   ((int)(uint)(byte)end_local[3] >> 5))] & 1 << (end_local[3] & 0x1fU)) == 0) {
          *nextTokPtr = (char *)pbVar4;
          return 0;
        }
      case 0x16:
      case 0x18:
        end_local = end_local + 4;
      }
      break;
    case 0x1d:
      if ((namingBitmap
           [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(byte)*end_local] * 8 +
                 ((int)(uint)(byte)end_local[1] >> 5))] & 1 << (end_local[1] & 0x1fU)) == 0) {
        *nextTokPtr = end_local;
        return 0;
      }
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      end_local = end_local + 2;
    }
  } while( true );
LAB_0091a361:
  end_local = pcVar3 + 2;
  if (end_local == end) {
    return -1;
  }
  if (*end_local == '\0') {
    local_6c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)pcVar3[3]);
  }
  else {
    local_6c = unicode_byte_type(*end_local,pcVar3[3]);
  }
  switch(local_6c) {
  case 5:
    if ((long)end - (long)end_local < 2) {
      return -2;
    }
    *nextTokPtr = end_local;
    return 0;
  case 6:
    if ((long)end - (long)end_local < 3) {
      return -2;
    }
    *nextTokPtr = end_local;
    return 0;
  case 7:
    if ((long)end - (long)end_local < 4) {
      return -2;
    }
    *nextTokPtr = end_local;
    return 0;
  default:
    *nextTokPtr = end_local;
    return 0;
  case 9:
  case 10:
  case 0x15:
    pcVar3 = end_local;
    break;
  case 0xb:
LAB_0091a53f:
    *nextTokPtr = end_local + 2;
    return 2;
  case 0x11:
LAB_0091a55c:
    pcVar3 = end_local + 2;
    if (pcVar3 == end) {
      return -1;
    }
    if ((*pcVar3 == '\0') && (end_local[3] == '>')) {
      *nextTokPtr = end_local + 4;
      return 4;
    }
    *nextTokPtr = pcVar3;
    return 0;
  case 0x1d:
    if ((namingBitmap
         [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)*end_local] * 8 +
               ((int)(uint)(byte)pcVar3[3] >> 5))] & 1 << (pcVar3[3] & 0x1fU)) == 0) {
      *nextTokPtr = end_local;
      return 0;
    }
  case 0x16:
  case 0x18:
    iVar2 = big2_scanAtts(enc,pcVar3 + 4,end,nextTokPtr);
    return iVar2;
  }
  goto LAB_0091a361;
}

Assistant:

static
int PREFIX(scanLt)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon;
#endif
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_EXCL:
    if ((ptr += MINBPC(enc)) == end)
      return XML_TOK_PARTIAL;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_MINUS:
      return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_LSQB:
      return PREFIX(scanCdataSection)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_QUEST:
    return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_SOL:
    return PREFIX(scanEndTag)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
#ifdef XML_NS
  hadColon = 0;
#endif
  /* we have a start-tag */
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      {
        ptr += MINBPC(enc);
        while (ptr != end) {
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_GT:
            goto gt;
          case BT_SOL:
            goto sol;
          case BT_S: case BT_CR: case BT_LF:
            ptr += MINBPC(enc);
            continue;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          return PREFIX(scanAtts)(enc, ptr, end, nextTokPtr);
        }
        return XML_TOK_PARTIAL;
      }
    case BT_GT:
    gt:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_START_TAG_NO_ATTS;
    case BT_SOL:
    sol:
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_EMPTY_ELEMENT_NO_ATTS;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}